

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O3

void mxx::impl::
     samplesort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,std::less<TwoBSA<unsigned_int>>,false>
               (undefined8 begin,undefined8 end,undefined8 param_3)

{
  datatype dt;
  datatype local_30;
  
  local_30.mpitype = datatype_contiguous<unsigned_int,_3UL>::get_type();
  local_30._vptr_datatype = (_func_int **)&PTR__datatype_001aaf70;
  local_30.builtin = false;
  samplesort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,std::less<TwoBSA<unsigned_int>>,false>
            (begin,end,local_30.mpitype,param_3);
  datatype::~datatype(&local_30);
  return;
}

Assistant:

void samplesort(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm)
{
    // get value type of underlying data
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;

    // get MPI type
    mxx::datatype dt = mxx::get_datatype<value_type>();
    MPI_Datatype mpi_dt = dt.type();

    // sort
    impl::samplesort<_Iterator, _Compare, _Stable>(begin, end, comp, mpi_dt, comm);
}